

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# JavascriptObject.cpp
# Opt level: O3

Var Js::JavascriptObject::ToStringHelper(Var thisArg,ScriptContext *scriptContext)

{
  code *pcVar1;
  bool bVar2;
  int iVar3;
  BOOL BVar4;
  undefined4 *puVar5;
  RecyclableObject *pRVar6;
  undefined4 extraout_var;
  Var thisArg_00;
  JavascriptString *pJVar7;
  ScriptContext *__localScriptContext;
  TypeId type;
  void *unaff_retaddr;
  Var pvStack_98;
  Var result;
  void *local_88;
  void *pvStack_80;
  ScriptContext *local_78;
  ScriptEntryExitRecord *pSStack_70;
  undefined8 local_68;
  undefined8 local_60;
  undefined1 *local_58;
  undefined1 local_50 [8];
  Var values [1];
  
  if (thisArg == (Var)0x0) {
    AssertCount = AssertCount + 1;
    Throw::LogAssert();
    puVar5 = (undefined4 *)__tls_get_addr(&PTR_01548f08);
    *puVar5 = 1;
    bVar2 = Throw::ReportAssert("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Runtime/./Language/JavascriptOperators.inl"
                                ,0x14,"(aValue != nullptr)","GetTypeId aValue is null");
    if (!bVar2) goto LAB_00ce057a;
    *puVar5 = 0;
LAB_00ce034c:
    pRVar6 = UnsafeVarTo<Js::RecyclableObject>(thisArg);
    if (pRVar6 == (RecyclableObject *)0x0) {
      AssertCount = AssertCount + 1;
      Throw::LogAssert();
      puVar5 = (undefined4 *)__tls_get_addr(&PTR_01548f08);
      *puVar5 = 1;
      bVar2 = Throw::ReportAssert("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Runtime/./Language/JavascriptOperators.inl"
                                  ,0xb,"(obj != nullptr)","GetTypeId aValue is null");
      if (!bVar2) goto LAB_00ce057a;
      *puVar5 = 0;
    }
    type = ((pRVar6->type).ptr)->typeId;
    if ((int)type < 0x58) {
      if (type == TypeIds_HostDispatch) {
        pRVar6 = VarTo<Js::RecyclableObject>(thisArg);
        iVar3 = (*(pRVar6->super_FinalizableObject).super_IRecyclerVisitedObject.
                  _vptr_IRecyclerVisitedObject[0x56])(pRVar6);
        type = TypeIds_HostDispatch;
        if (CONCAT44(extraout_var,iVar3) == 0) {
          pvStack_98 = (Var)0x0;
          local_58 = local_50;
          local_60 = 0x2000001;
          local_50 = (undefined1  [8])thisArg;
          iVar3 = (*(pRVar6->super_FinalizableObject).super_IRecyclerVisitedObject.
                    _vptr_IRecyclerVisitedObject[0x55])(pRVar6,EntryToString);
          if (iVar3 != 0) {
            return pvStack_98;
          }
        }
      }
      else if ((type - TypeIds_Int8Array < 0xd) &&
              (scriptContext->threadContext->isScriptActive == false)) {
        local_78 = (ScriptContext *)0x0;
        pSStack_70 = (ScriptEntryExitRecord *)0x0;
        local_88 = (void *)0x0;
        pvStack_80 = (void *)0x0;
        pvStack_98 = (Var)0x0;
        result = (Var)0x0;
        local_68._0_4_ = ExceptionType_None;
        local_68._4_4_ = 0;
        EnterScriptObject::EnterScriptObject
                  ((EnterScriptObject *)local_50,scriptContext,(ScriptEntryExitRecord *)&pvStack_98,
                   unaff_retaddr,&stack0x00000000,false,false,false);
        ScriptContext::OnScriptStart(scriptContext,false,true);
        EnterScriptObject::VerifyEnterScript((EnterScriptObject *)local_50);
        pJVar7 = ToStringTagHelper(thisArg,scriptContext,type);
        EnterScriptObject::~EnterScriptObject((EnterScriptObject *)local_50);
        return pJVar7;
      }
      goto LAB_00ce04c1;
    }
    BVar4 = RecyclableObject::IsExternal(pRVar6);
    if (BVar4 != 0) goto LAB_00ce04c1;
    AssertCount = AssertCount + 1;
    Throw::LogAssert();
    puVar5 = (undefined4 *)__tls_get_addr(&PTR_01548f08);
    *puVar5 = 1;
    bVar2 = Throw::ReportAssert("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Runtime/./Language/JavascriptOperators.inl"
                                ,0xe,"(typeId < TypeIds_Limit || obj->IsExternal())",
                                "GetTypeId aValue has invalid TypeId");
    if (!bVar2) {
LAB_00ce057a:
      pcVar1 = (code *)invalidInstructionException();
      (*pcVar1)();
    }
  }
  else {
    if (((ulong)thisArg & 0x1ffff00000000) == 0x1000000000000 ||
        ((ulong)thisArg & 0xffff000000000000) != 0x1000000000000) {
      type = TypeIds_FirstNumberType;
      if ((((ulong)thisArg & 0xffff000000000000) == 0x1000000000000) ||
         (type = TypeIds_Number, (ulong)thisArg >> 0x32 != 0)) goto LAB_00ce04c1;
      goto LAB_00ce034c;
    }
    AssertCount = AssertCount + 1;
    Throw::LogAssert();
    puVar5 = (undefined4 *)__tls_get_addr(&PTR_01548f08);
    *puVar5 = 1;
    bVar2 = Throw::ReportAssert("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Runtime/./Language/TaggedInt.inl"
                                ,0x2a,"((uintptr_t)aValue >> 32 == (AtomTag << 16))",
                                "(uintptr_t)aValue >> 32 == (AtomTag << 16)");
    if (!bVar2) goto LAB_00ce057a;
    type = TypeIds_FirstNumberType;
  }
  *puVar5 = 0;
LAB_00ce04c1:
  thisArg_00 = CrossSite::MarshalVar(scriptContext,thisArg,false);
  pJVar7 = ToStringTagHelper(thisArg_00,scriptContext,type);
  return pJVar7;
}

Assistant:

Var JavascriptObject::ToStringHelper(Var thisArg, ScriptContext* scriptContext)
{
    TypeId type = JavascriptOperators::GetTypeId(thisArg);

    // We first need to make sure we are in the right context.
    if (type == TypeIds_HostDispatch)
    {
        RecyclableObject* hostDispatchObject = VarTo<RecyclableObject>(thisArg);
        const DynamicObject* remoteObject = hostDispatchObject->GetRemoteObject();
        if (!remoteObject)
        {
            Var result = nullptr;
            Js::Var values[1];
            Js::CallInfo info(Js::CallFlags_Value, 1);
            Js::Arguments args(info, values);
            values[0] = thisArg;
            if (hostDispatchObject->InvokeBuiltInOperationRemotely(EntryToString, args, &result))
            {
                return result;
            }
        }
    }

    // Dispatch to @@toStringTag implementation.
    if (type >= TypeIds_TypedArrayMin && type <= TypeIds_TypedArrayMax && !scriptContext->GetThreadContext()->IsScriptActive())
    {
        // Use external call for typedarray in the debugger.
        Var toStringValue = nullptr;
        BEGIN_JS_RUNTIME_CALL_EX(scriptContext, false);
        toStringValue = ToStringTagHelper(thisArg, scriptContext, type);
        END_JS_RUNTIME_CALL(scriptContext);
        return toStringValue;
    }

    // By this point, we should be in the correct context, but the thisArg may still need to be marshalled (for to the implicit ToObject conversion call.)
    return ToStringTagHelper(CrossSite::MarshalVar(scriptContext, thisArg), scriptContext, type);
}